

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

natwm_error color_value_from_config_value(config_value *config_value,color_value **result)

{
  color_value *pcStack_28;
  natwm_error err;
  color_value *value;
  color_value **result_local;
  config_value *config_value_local;
  
  if ((config_value == (config_value *)0x0) || (config_value->type != STRING)) {
    config_value_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    pcStack_28 = (color_value *)0x0;
    value = (color_value *)result;
    result_local = (color_value **)config_value;
    config_value_local._4_4_ =
         color_value_from_string((config_value->data).string,&stack0xffffffffffffffd8);
    if (config_value_local._4_4_ == NO_ERROR) {
      value->string = (char *)pcStack_28;
      config_value_local._4_4_ = NO_ERROR;
    }
  }
  return config_value_local._4_4_;
}

Assistant:

static enum natwm_error color_value_from_config_value(const struct config_value *config_value,
                                                      struct color_value **result)
{
        if (config_value == NULL || config_value->type != STRING) {
                return INVALID_INPUT_ERROR;
        }

        struct color_value *value = NULL;
        enum natwm_error err = color_value_from_string(config_value->data.string, &value);

        if (err != NO_ERROR) {
                return err;
        }

        *result = value;

        return NO_ERROR;
}